

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O0

ares_dns_rr_t * has_opt(ares_dns_record_t *dnsrec,ares_dns_section_t section)

{
  int iVar1;
  ares_dns_rr_t *paVar2;
  ares_dns_rr_t *rr;
  size_t i;
  ares_dns_section_t section_local;
  ares_dns_record_t *dnsrec_local;
  
  rr = (ares_dns_rr_t *)0x0;
  while( true ) {
    paVar2 = (ares_dns_rr_t *)ares_dns_record_rr_cnt(dnsrec,section);
    if (paVar2 <= rr) {
      return (ares_dns_rr_t *)0x0;
    }
    paVar2 = (ares_dns_rr_t *)ares_dns_record_rr_get_const(dnsrec,section,rr);
    iVar1 = ares_dns_rr_get_type(paVar2);
    if (iVar1 == 0x29) break;
    rr = rr + 1;
  }
  return paVar2;
}

Assistant:

static const ares_dns_rr_t *has_opt(const ares_dns_record_t *dnsrec,
                                    ares_dns_section_t       section)
{
  size_t i;
  for (i = 0; i < ares_dns_record_rr_cnt(dnsrec, section); i++) {
    const ares_dns_rr_t *rr = ares_dns_record_rr_get_const(dnsrec, section, i);
    if (ares_dns_rr_get_type(rr) == ARES_REC_TYPE_OPT) {
      return rr;
    }
  }
  return NULL;
}